

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cg.c
# Opt level: O1

char * generate_arg_str(sm_ref net)

{
  char *__s;
  char *__ptr;
  size_t sVar1;
  char cVar2;
  sm_ref psVar3;
  int iVar4;
  uint uVar5;
  ulong uVar6;
  list_struct *plVar7;
  ulong uVar8;
  int param_num;
  
  __s = (char *)malloc(4);
  __ptr = (char *)malloc(1);
  uVar5 = 0;
  if (net->node_type == cod_compound_statement) {
    plVar7 = (net->node).compound_statement.decls;
  }
  else {
    plVar7 = (sm_list)0x0;
  }
  *__s = '\0';
  if (plVar7 != (sm_list)0x0) {
    uVar8 = 0;
    do {
      psVar3 = plVar7->node;
      iVar4 = (int)uVar8;
      uVar6 = uVar8;
      if (psVar3->node_type == cod_declaration) {
        uVar5 = (psVar3->node).declaration.param_num;
        if ((ulong)uVar5 != 0xffffffff) {
          if (iVar4 <= (int)uVar5) {
            uVar6 = (ulong)uVar5 + 1;
            __ptr = (char *)realloc(__ptr,uVar6);
            memset(__ptr + (uVar8 & 0xffffffff),0xff,(long)(int)(uVar5 - iVar4));
          }
          cVar2 = *(char *)((long)&psVar3->node + 100);
LAB_00125769:
          __ptr[(int)uVar5] = cVar2;
          uVar8 = uVar6;
        }
      }
      else if (psVar3->node_type == cod_array_type_decl) {
        for (; psVar3->node_type == cod_array_type_decl;
            psVar3 = (psVar3->node).declaration.freeable_complex_type) {
        }
        uVar5 = (psVar3->node).declaration.param_num;
        if ((ulong)uVar5 != 0xffffffff) {
          cVar2 = '\b';
          if (iVar4 <= (int)uVar5) {
            uVar6 = (ulong)uVar5 + 1;
            __ptr = (char *)realloc(__ptr,uVar6);
            memset(__ptr + (uVar8 & 0xffffffff),0xff,(long)(int)(uVar5 - iVar4));
          }
          goto LAB_00125769;
        }
      }
      uVar5 = (uint)uVar8;
      plVar7 = plVar7->next;
    } while (plVar7 != (list_struct *)0x0);
  }
  if (uVar5 == 1) {
    uVar5 = (uint)(*__ptr != '\v');
  }
  if (0 < (int)uVar5) {
    uVar8 = 0;
    do {
      if (__ptr[uVar8] == -1) {
        printf("Arg %d not declared\n",uVar8 & 0xffffffff);
        return __s;
      }
      sVar1 = strlen(__s);
      sVar1 = sVar1 + 8;
      __s = (char *)realloc(__s,sVar1);
      strncat(__s,"%",sVar1);
      strncat(__s,arg_type_str_rel + *(int *)(arg_type_str_rel + (long)__ptr[uVar8] * 4),sVar1);
      uVar8 = uVar8 + 1;
    } while (uVar5 != uVar8);
  }
  free(__ptr);
  return __s;
}

Assistant:

char *
generate_arg_str(sm_ref net)
{
    sm_list decls = NULL;
    char *arg_str = malloc(4);  /* 4 makes valgrind happier */
    signed char *arg_types = malloc(1);
    int arg_count = 0;
    int i;
    if (net->node_type == cod_compound_statement) {
	decls = net->node.compound_statement.decls;
    }
    arg_str[0] = 0;
    while (decls != NULL) {
	sm_ref decl = decls->node;
	
	if (decl->node_type == cod_declaration) {
	    if (decl->node.declaration.param_num != -1) {
		/* parameter */
		int param_num = decl->node.declaration.param_num;
		if (param_num >= arg_count) {
		    arg_types = realloc(arg_types, param_num + 1);
		    memset(arg_types + arg_count, -1, 
			   param_num - arg_count);
		    arg_count = param_num + 1;
		}
		arg_types[param_num] = decl->node.declaration.cg_type;
	    }
	} else if (decl->node_type == cod_array_type_decl) {
	    while(decl->node_type == cod_array_type_decl)
		decl = decl->node.array_type_decl.element_ref;
	    if (decl->node.declaration.param_num != -1) {
		int param_num = decl->node.declaration.param_num;
		if (param_num >= arg_count) {
		    arg_types = realloc(arg_types, param_num + 1);
		    memset(arg_types + arg_count, -1, 
			   param_num - arg_count);
		    arg_count = param_num + 1;
		}
		arg_types[param_num] = DILL_P;
	    }
	}
	    
	decls = decls->next;
    }
    if ((arg_count == 1) && (arg_types[0] == DILL_V)) {
	arg_count = 0;
    }
    for (i = 0; i < arg_count ; i++) {
	size_t len;
	if (arg_types[i] == -1) {
	    printf("Arg %d not declared\n", i);
	    return arg_str;
	}
	len = strlen(arg_str) + 8;
	arg_str = realloc(arg_str, len);
	strncat(arg_str, "%", len);
	strncat(arg_str, arg_type_str[arg_types[i]], len);
    }
    free(arg_types);
    return arg_str;
}